

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_certificate_verify(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  int iVar2;
  mbedtls_pk_type_t type;
  size_t sig_len_00;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  mbedtls_md_type_t md_alg;
  mbedtls_pk_type_t pk_alg;
  size_t hashlen;
  uchar *hash_start;
  uchar hash [48];
  size_t sig_len;
  size_t i;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  hashlen = (size_t)&hash_start;
  pmVar1 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xdee,"=> parse certificate verify");
  if (((((pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK) ||
        (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK)) ||
       (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK)) ||
      ((pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
       (pmVar1->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE)))) ||
     (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xdf7,"<= skip parse certificate verify");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else {
    do {
      iVar2 = mbedtls_ssl_read_record_layer(ssl);
      if (iVar2 != 0) {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xe01,"mbedtls_ssl_read_record_layer",iVar2);
        return iVar2;
      }
      ssl_local._4_4_ = mbedtls_ssl_handle_message_type(ssl);
    } while (ssl_local._4_4_ == -0x6680);
    if (ssl_local._4_4_ == 0) {
      ssl->state = ssl->state + 1;
      if ((ssl->in_msgtype == 0x16) && (*ssl->in_msg == '\x0f')) {
        sig_len = mbedtls_ssl_hs_hdr_len(ssl);
        if (ssl->minor_ver == 3) {
          if (ssl->minor_ver != 3) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xe6c,"should never happen");
            return -0x6c00;
          }
          if (ssl->in_hslen < sig_len + 2) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xe39,"bad certificate verify message");
            return -0x7d80;
          }
          ciphersuite_info._0_4_ = mbedtls_ssl_md_alg_from_hash(ssl->in_msg[sig_len]);
          if (((mbedtls_md_type_t)ciphersuite_info == MBEDTLS_MD_NONE) ||
             (iVar2 = mbedtls_ssl_set_calc_verify_md(ssl,(uint)ssl->in_msg[sig_len]), iVar2 != 0)) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xe45,"peer not adhering to requested sig_alg for verify message");
            return -0x7d80;
          }
          if ((mbedtls_md_type_t)ciphersuite_info == MBEDTLS_MD_SHA1) {
            hashlen = (size_t)(hash + 8);
          }
          _md_alg = 0;
          type = mbedtls_ssl_pk_alg_from_sig(ssl->in_msg[sig_len + 1]);
          if (type == MBEDTLS_PK_NONE) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xe5a,"peer not adhering to requested sig_alg for verify message");
            return -0x7d80;
          }
          iVar2 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,type);
          if (iVar2 == 0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xe63,"sig_alg doesn\'t match cert key");
            return -0x7d80;
          }
          sig_len = sig_len + 2;
        }
        else {
          ciphersuite_info._0_4_ = MBEDTLS_MD_NONE;
          _md_alg = 0x24;
          iVar2 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,MBEDTLS_PK_ECDSA);
          if (iVar2 != 0) {
            hashlen = (size_t)(hash + 8);
            _md_alg = 0x14;
            ciphersuite_info._0_4_ = MBEDTLS_MD_SHA1;
          }
        }
        if (ssl->in_hslen < sig_len + 2) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0xe72,"bad certificate verify message");
          ssl_local._4_4_ = -0x7d80;
        }
        else {
          sig_len_00 = (size_t)(int)(uint)CONCAT11(ssl->in_msg[sig_len],ssl->in_msg[sig_len + 1]);
          if (sig_len + 2 + sig_len_00 == ssl->in_hslen) {
            (*ssl->handshake->calc_verify)(ssl,(uchar *)&hash_start);
            ssl_local._4_4_ =
                 mbedtls_pk_verify(&ssl->session_negotiate->peer_cert->pk,
                                   (mbedtls_md_type_t)ciphersuite_info,(uchar *)hashlen,_md_alg,
                                   ssl->in_msg + sig_len + 2,sig_len_00);
            if (ssl_local._4_4_ == 0) {
              mbedtls_ssl_update_handshake_status(ssl);
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,0xe8c,"<= parse certificate verify");
            }
            else {
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,0xe86,"mbedtls_pk_verify",ssl_local._4_4_);
            }
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0xe7b,"bad certificate verify message");
            ssl_local._4_4_ = -0x7d80;
          }
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0xe15,"bad certificate verify message");
        ssl_local._4_4_ = -0x7d80;
      }
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0xe0b,"mbedtls_ssl_handle_message_type",ssl_local._4_4_);
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_certificate_verify( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, sig_len;
    unsigned char hash[48];
    unsigned char *hash_start = hash;
    size_t hashlen;
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    mbedtls_pk_type_t pk_alg;
#endif
    mbedtls_md_type_t md_alg;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate verify" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE ||
        ssl->session_negotiate->peer_cert == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate verify" ) );
        ssl->state++;
        return( 0 );
    }

    /* Read the message without adding it to the checksum */
    do {

        if( ( ret = mbedtls_ssl_read_record_layer( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ssl_read_record_layer" ), ret );
            return( ret );
        }

        ret = mbedtls_ssl_handle_message_type( ssl );

    } while( MBEDTLS_ERR_SSL_NON_FATAL == ret );

    if( 0 != ret )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ssl_handle_message_type" ), ret );
        return( ret );
    }

    ssl->state++;

    /* Process the message contents */
    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE ||
        ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE_VERIFY )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate verify message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
    }

    i = mbedtls_ssl_hs_hdr_len( ssl );

    /*
     *  struct {
     *     SignatureAndHashAlgorithm algorithm; -- TLS 1.2 only
     *     opaque signature<0..2^16-1>;
     *  } DigitallySigned;
     */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        md_alg = MBEDTLS_MD_NONE;
        hashlen = 36;

        /* For ECDSA, use SHA-1, not MD-5 + SHA-1 */
        if( mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk,
                        MBEDTLS_PK_ECDSA ) )
        {
            hash_start += 16;
            hashlen -= 16;
            md_alg = MBEDTLS_MD_SHA1;
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 ||
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        if( i + 2 > ssl->in_hslen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate verify message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
        }

        /*
         * Hash
         */
        md_alg = mbedtls_ssl_md_alg_from_hash( ssl->in_msg[i] );

        if( md_alg == MBEDTLS_MD_NONE || mbedtls_ssl_set_calc_verify_md( ssl, ssl->in_msg[i] ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "peer not adhering to requested sig_alg"
                                " for verify message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
        }

#if !defined(MBEDTLS_MD_SHA1)
        if( MBEDTLS_MD_SHA1 == md_alg )
            hash_start += 16;
#endif

        /* Info from md_alg will be used instead */
        hashlen = 0;

        i++;

        /*
         * Signature
         */
        if( ( pk_alg = mbedtls_ssl_pk_alg_from_sig( ssl->in_msg[i] ) )
                        == MBEDTLS_PK_NONE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "peer not adhering to requested sig_alg"
                                " for verify message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
        }

        /*
         * Check the certificate's key type matches the signature alg
         */
        if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk, pk_alg ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "sig_alg doesn't match cert key" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
        }

        i++;
    }
    else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    if( i + 2 > ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate verify message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
    }

    sig_len = ( ssl->in_msg[i] << 8 ) | ssl->in_msg[i+1];
    i += 2;

    if( i + sig_len != ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate verify message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY );
    }

    /* Calculate hash and verify signature */
    ssl->handshake->calc_verify( ssl, hash );

    if( ( ret = mbedtls_pk_verify( &ssl->session_negotiate->peer_cert->pk,
                           md_alg, hash_start, hashlen,
                           ssl->in_msg + i, sig_len ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_verify", ret );
        return( ret );
    }

    mbedtls_ssl_update_handshake_status( ssl );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate verify" ) );

    return( ret );
}